

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void __thiscall
kj::Array<capnp::Orphan<capnp::compiler::Expression>_>::dispose
          (Array<capnp::Orphan<capnp::compiler::Expression>_> *this)

{
  Orphan<capnp::compiler::Expression> *pOVar1;
  size_t sVar2;
  
  pOVar1 = this->ptr;
  if (pOVar1 != (Orphan<capnp::compiler::Expression> *)0x0) {
    sVar2 = this->size_;
    this->ptr = (Orphan<capnp::compiler::Expression> *)0x0;
    this->size_ = 0;
    (*(code *)**(undefined8 **)this->disposer)
              (this->disposer,pOVar1,0x20,sVar2,sVar2,
               ArrayDisposer::Dispose_<capnp::Orphan<capnp::compiler::Expression>_>::destruct);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    size_t sizeCopy = size_;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      size_ = 0;
      disposer->dispose(ptrCopy, sizeCopy, sizeCopy);
    }
  }